

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_duration * mg_duration_make(int64_t months,int64_t days,int64_t seconds,int64_t nanoseconds)

{
  mg_duration *pmVar1;
  
  pmVar1 = (mg_duration *)mg_allocator_malloc(&mg_system_allocator,0x20);
  if (pmVar1 == (mg_duration *)0x0) {
    pmVar1 = (mg_duration *)0x0;
  }
  else {
    pmVar1->months = months;
    pmVar1->days = days;
    pmVar1->seconds = seconds;
    pmVar1->nanoseconds = nanoseconds;
  }
  return pmVar1;
}

Assistant:

mg_duration *mg_duration_make(int64_t months, int64_t days, int64_t seconds,
                              int64_t nanoseconds) {
  mg_duration *dur = mg_duration_alloc(&mg_system_allocator);
  if (!dur) {
    return NULL;
  }
  dur->months = months;
  dur->days = days;
  dur->seconds = seconds;
  dur->nanoseconds = nanoseconds;
  return dur;
}